

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent_info::torrent_info(torrent_info *this,string *filename,load_torrent_limits *cfg)

{
  sha1_hash *psVar1;
  sha256_hash *psVar2;
  bool bVar3;
  int iVar4;
  span<const_char> buffer;
  error_code ec;
  vector<char,_std::allocator<char>_> buf;
  bdecode_node e;
  int in_stack_ffffffffffffff50;
  error_code local_a8;
  vector<char,_std::allocator<char>_> local_98;
  copy_ptr<const_libtorrent::file_storage> *local_78;
  bdecode_node local_70;
  
  file_storage::file_storage(&this->m_files);
  local_78 = &this->m_orig_files;
  memset(local_78,0,0xf0);
  (this->m_comment)._M_dataplus._M_p = (pointer)&(this->m_comment).field_2;
  (this->m_comment)._M_string_length = 0;
  (this->m_comment).field_2._M_local_buf[0] = '\0';
  (this->m_created_by)._M_dataplus._M_p = (pointer)&(this->m_created_by).field_2;
  (this->m_created_by)._M_string_length = 0;
  (this->m_created_by).field_2._M_local_buf[0] = '\0';
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_info_dict).m_tokens.
  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_info_dict).m_root_tokens = (bdecode_token *)0x0;
  *(undefined8 *)((long)&(this->m_info_dict).m_root_tokens + 4) = 0;
  *(undefined8 *)((long)&(this->m_info_dict).m_buffer + 4) = 0;
  (this->m_info_dict).m_token_idx = -1;
  (this->m_info_dict).m_last_index = -1;
  (this->m_info_dict).m_last_token = -1;
  (this->m_info_dict).m_size = -1;
  this->m_creation_date = 0;
  (this->m_info_hash).v1.m_number._M_elems[0] = 0;
  (this->m_info_hash).v1.m_number._M_elems[1] = 0;
  psVar1 = &(this->m_info_hash).v1;
  (psVar1->m_number)._M_elems[2] = 0;
  (psVar1->m_number)._M_elems[3] = 0;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[1] = 0;
  (psVar2->m_number)._M_elems[2] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[3] = 0;
  (psVar2->m_number)._M_elems[4] = 0;
  psVar2 = &(this->m_info_hash).v2;
  (psVar2->m_number)._M_elems[5] = 0;
  (psVar2->m_number)._M_elems[6] = 0;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 7) = 0;
  *(undefined8 *)((long)&this->m_piece_hashes + 1) = 0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_a8.val_ = 0;
  local_a8.failed_ = false;
  local_a8.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar4 = anon_unknown_1::load_file
                    ((string *)(filename->_M_dataplus)._M_p,&local_98,&local_a8,cfg->max_buffer_size
                    );
  if (iVar4 < 0) {
    aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_a8);
  }
  buffer.m_ptr = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                 -(long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start;
  buffer.m_len = (difference_type)&local_a8;
  bdecode(&local_70,
          (libtorrent *)
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start,buffer,(error_code *)0x0,(int *)(ulong)(uint)cfg->max_decode_depth,
          cfg->max_decode_tokens,in_stack_ffffffffffffff50);
  if (local_a8.failed_ == false) {
    bVar3 = parse_torrent_file(this,&local_70,&local_a8,cfg);
    if (bVar3) {
      if (local_70.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.m_tokens.
                        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((libtorrent *)
          local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (libtorrent *)0x0) {
        operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  }
  aux::throw_ex<boost::system::system_error,boost::system::error_code&>(&local_a8);
}

Assistant:

torrent_info::torrent_info(std::string const& filename
		, load_torrent_limits const& cfg)
	{
		std::vector<char> buf;
		error_code ec;
		int ret = load_file(filename, buf, ec, cfg.max_buffer_size);
		if (ret < 0) aux::throw_ex<system_error>(ec);

		bdecode_node e = bdecode(buf, ec, nullptr, cfg.max_decode_depth
			, cfg.max_decode_tokens);
		if (ec) aux::throw_ex<system_error>(ec);

		if (!parse_torrent_file(e, ec, cfg))
			aux::throw_ex<system_error>(ec);

		INVARIANT_CHECK;
	}